

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_Server_processBinaryMessage
               (UA_Server *server,UA_Connection *connection,UA_ByteString *message)

{
  UA_StatusCode UVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong local_98;
  UA_TcpMessageHeader ackHeader;
  UA_TcpMessageHeader tcpMessageHeader;
  UA_TcpHelloMessage helloMessage;
  UA_ByteString local_58;
  UA_UInt32 local_44;
  UA_UInt32 local_40;
  UA_TcpAcknowledgeMessage ackMessage;
  size_t offset;
  
  if (connection->channel != (UA_SecureChannel *)0x0) {
    UA_SecureChannel_processChunks
              (connection->channel,message,UA_Server_processSecureChannelMessage,server);
    return;
  }
  ackMessage.maxMessageSize = 0;
  ackMessage.maxChunkCount = 0;
  UVar1 = UA_decodeBinary(message,(size_t *)&ackMessage.maxMessageSize,&ackHeader,UA_TRANSPORT + 8);
  if (UVar1 == 0) {
    uVar2 = ackHeader.messageTypeAndChunkType & 0xffffff;
    if (uVar2 < 0x4e504f) {
      if (((uVar2 != 0x47534d) && (uVar2 == 0x4c4548)) &&
         (UVar1 = UA_decodeBinary(message,(size_t *)&ackMessage.maxMessageSize,&tcpMessageHeader,
                                  UA_TRANSPORT + 2), UVar1 == 0)) {
        (connection->remoteConf).maxChunkCount = helloMessage.sendBufferSize;
        (connection->remoteConf).maxMessageSize = helloMessage.receiveBufferSize;
        (connection->remoteConf).protocolVersion = tcpMessageHeader.messageTypeAndChunkType;
        (connection->remoteConf).recvBufferSize = tcpMessageHeader.messageSize;
        if (tcpMessageHeader.messageSize < (connection->localConf).sendBufferSize) {
          (connection->localConf).sendBufferSize = tcpMessageHeader.messageSize;
        }
        (connection->remoteConf).sendBufferSize = helloMessage.protocolVersion;
        if (helloMessage.protocolVersion < (connection->localConf).recvBufferSize) {
          (connection->localConf).recvBufferSize = helloMessage.protocolVersion;
        }
        connection->state = UA_CONNECTION_ESTABLISHED;
        deleteMembers_noInit(&tcpMessageHeader,UA_TRANSPORT + 2);
        tcpMessageHeader.messageTypeAndChunkType = 0;
        tcpMessageHeader.messageSize = 0;
        local_44 = (connection->localConf).protocolVersion;
        local_40 = (connection->localConf).recvBufferSize;
        ackMessage.protocolVersion = (connection->localConf).sendBufferSize;
        ackMessage.receiveBufferSize = (connection->localConf).maxMessageSize;
        ackMessage.sendBufferSize = (connection->localConf).maxChunkCount;
        local_98 = 0x1c464b4341;
        local_58.length = 0;
        local_58.data = (UA_Byte *)0x0;
        UVar1 = (*connection->getSendBuffer)
                          (connection,(size_t)ackMessage.protocolVersion,&local_58);
        if (UVar1 != 0) {
          return;
        }
        pos = local_58.data;
        end = local_58.data + local_58.length;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = &local_58;
        UA_encodeBinaryInternal(&local_98,UA_TRANSPORT + 8);
        end = local_58.data + local_58.length;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = &local_58;
        UA_encodeBinaryInternal(&local_44,UA_TRANSPORT + 6);
        local_58.length = local_98 >> 0x20;
        (*connection->send)(connection,&local_58);
        return;
      }
    }
    else {
      if (uVar2 == 0x4e504f) {
        local_44 = 0;
        UVar1 = UA_decodeBinary(message,(size_t *)&ackMessage.maxMessageSize,&local_44,UA_TYPES + 6)
        ;
        if (UVar1 != 0) {
          (*connection->close)(connection);
        }
        tcpMessageHeader = (UA_TcpMessageHeader)(message->length - 0xc);
        processOPN(server,connection,local_44,(UA_ByteString *)&tcpMessageHeader);
        return;
      }
      if (((uVar2 != 0x4f4c43) && (uVar2 == 0x525245)) &&
         (UVar1 = UA_decodeBinary(message,(size_t *)&ackMessage.maxMessageSize,&tcpMessageHeader,
                                  UA_TRANSPORT + 3), UVar1 == 0)) {
        lVar4 = 0;
        lVar3 = 0x142ba0;
        do {
          if (*(UA_UInt32 *)((long)&statusCodeDescriptions[0].code + lVar4) ==
              tcpMessageHeader.messageTypeAndChunkType) {
            lVar3 = (long)&statusCodeDescriptions[0].code + lVar4;
            break;
          }
          lVar4 = lVar4 + 0x18;
        } while (lVar4 != 0x1578);
        UA_LOG_ERROR((server->config).logger,UA_LOGCATEGORY_NETWORK,
                     "Client replied with an error message: %s %.*s",*(undefined8 *)(lVar3 + 8),
                     helloMessage._0_8_,helloMessage._8_8_);
        return;
      }
    }
  }
  (*connection->close)(connection);
  return;
}

Assistant:

void
UA_Server_processBinaryMessage(UA_Server *server, UA_Connection *connection,
                               const UA_ByteString *message) {
    UA_SecureChannel *channel = connection->channel;
    if(channel) {
        /* Assemble chunks in the securechannel and process complete messages */
        UA_StatusCode retval = 
            UA_SecureChannel_processChunks(channel, message,
                 (UA_ProcessMessageCallback*)UA_Server_processSecureChannelMessage, server);
        if(retval != UA_STATUSCODE_GOOD)
            UA_LOG_TRACE_CHANNEL(server->config.logger, channel, "Procesing chunks "
                                 "resulted in error code %s", UA_StatusCode_name(retval));
    } else {
        /* Process messages without a channel and no chunking */
        size_t offset = 0;
        UA_TcpMessageHeader tcpMessageHeader;
        UA_StatusCode retval = UA_TcpMessageHeader_decodeBinary(message, &offset, &tcpMessageHeader);
        if(retval != UA_STATUSCODE_GOOD) {
            connection->close(connection);
            return;
        }

        /* Dispatch according to the message type */
        switch(tcpMessageHeader.messageTypeAndChunkType & 0x00ffffff) {
        case UA_MESSAGETYPE_ERR:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process ERR message", connection->sockfd);
            processERR(server, connection, message, &offset);
            break;
        case UA_MESSAGETYPE_HEL:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process HEL message", connection->sockfd);
            processHEL(connection, message, &offset);
            break;
        case UA_MESSAGETYPE_OPN: {
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process OPN message", connection->sockfd);
            UA_UInt32 channelId = 0;
            retval = UA_UInt32_decodeBinary(message, &offset, &channelId);
            if(retval != UA_STATUSCODE_GOOD)
                connection->close(connection);
            UA_ByteString offsetMessage = (UA_ByteString){
                .data = message->data + 12, .length = message->length - 12};
            processOPN(server, connection, channelId, &offsetMessage);
            break; }
        case UA_MESSAGETYPE_MSG:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Processing a MSG message not possible "
                         "without a SecureChannel", connection->sockfd);
            connection->close(connection);
            break;
        case UA_MESSAGETYPE_CLO:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Processing a CLO message not possible "
                         "without a SecureChannel", connection->sockfd);
            connection->close(connection);
            break;
        default:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Unknown message type", connection->sockfd);
            connection->close(connection);
        }
    }
}